

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleCols_16_C(uint16_t *dst_ptr,uint16_t *src_ptr,int dst_width,int x,int dx)

{
  int j;
  int dx_local;
  int x_local;
  int dst_width_local;
  uint16_t *src_ptr_local;
  uint16_t *dst_ptr_local;
  
  x_local = x;
  dst_ptr_local = dst_ptr;
  for (j = 0; j < dst_width + -1; j = j + 2) {
    *dst_ptr_local = src_ptr[x_local >> 0x10];
    dst_ptr_local[1] = src_ptr[dx + x_local >> 0x10];
    x_local = dx + dx + x_local;
    dst_ptr_local = dst_ptr_local + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst_ptr_local = src_ptr[x_local >> 0x10];
  }
  return;
}

Assistant:

void ScaleCols_16_C(uint16_t* dst_ptr,
                    const uint16_t* src_ptr,
                    int dst_width,
                    int x,
                    int dx) {
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst_ptr[0] = src_ptr[x >> 16];
    x += dx;
    dst_ptr[1] = src_ptr[x >> 16];
    x += dx;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    dst_ptr[0] = src_ptr[x >> 16];
  }
}